

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_overlay.cpp
# Opt level: O2

void __thiscall
Omega_h::Overlay::Overlay
          (Overlay *this,int *argc,char ***argv,Vector<3> *overlayGridCenter,double cellSize,
          size_t Nx,size_t Ny,size_t Nz)

{
  Mesh *__return_storage_ptr__;
  Int i_5;
  LO LVar1;
  long lVar2;
  long lVar3;
  int i;
  pointer pcVar4;
  long lVar5;
  double x_00;
  double y;
  undefined1 auVar6 [16];
  double z;
  string local_1f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1d8;
  Write<double> new_coords;
  double local_1b8 [3];
  Vector<3> *local_1a0;
  Write<double> local_198;
  Reals coords;
  undefined1 local_178 [16];
  Vector<3> x;
  Vector<3> diff;
  Vector<3> c_1;
  Adj local_f0;
  Adj local_c0;
  Adj local_90;
  Adj local_60;
  
  this->cell_size = cellSize;
  local_1d8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)cellSize;
  Library::Library(&this->library,argc,argv);
  Library::world((Library *)local_178);
  __return_storage_ptr__ = &this->mesh;
  x_00 = (double)local_1d8 *
         (((double)(Nx >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(Nx & 0xffffffff | 0x4330000000000000));
  y = (double)local_1d8 *
      (((double)(Ny >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
      (double)(Ny & 0xffffffff | 0x4330000000000000));
  auVar6._8_4_ = (int)(Nz >> 0x20);
  auVar6._0_8_ = Nz;
  auVar6._12_4_ = 0x45300000;
  z = ((auVar6._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(LO)Nz) - 4503599627370496.0)) * (double)local_1d8;
  local_1a0 = overlayGridCenter;
  build_box(__return_storage_ptr__,(CommPtr *)local_178,OMEGA_H_HYPERCUBE,x_00,y,z,(LO)Nx,(LO)Ny,
            (LO)Nz,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_178 + 8));
  local_1d8 = &this->silly_cells;
  (this->silly_nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->silly_nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->silly_faces).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->silly_nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->silly_faces).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->silly_faces).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->silly_edges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->silly_edges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->silly_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->silly_edges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->silly_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->silly_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  LVar1 = Omega_h::Mesh::nregions(__return_storage_ptr__);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(local_1d8,(long)LVar1);
  LVar1 = Omega_h::Mesh::nfaces(__return_storage_ptr__);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->silly_faces,(long)LVar1);
  LVar1 = Omega_h::Mesh::nedges(__return_storage_ptr__);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->silly_edges,(long)LVar1);
  LVar1 = Omega_h::Mesh::nverts(__return_storage_ptr__);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->silly_nodes,(long)LVar1);
  pcVar4 = (pointer)0x0;
  while( true ) {
    LVar1 = Omega_h::Mesh::nregions(__return_storage_ptr__);
    if ((long)LVar1 <= (long)pcVar4) break;
    local_1f8._M_dataplus._M_p = pcVar4;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (local_1d8,(unsigned_long *)&local_1f8);
    pcVar4 = pcVar4 + 1;
  }
  pcVar4 = (pointer)0x0;
  while( true ) {
    LVar1 = Omega_h::Mesh::nfaces(__return_storage_ptr__);
    if ((long)LVar1 <= (long)pcVar4) break;
    local_1f8._M_dataplus._M_p = pcVar4;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&this->silly_faces,(unsigned_long *)&local_1f8);
    pcVar4 = pcVar4 + 1;
  }
  pcVar4 = (pointer)0x0;
  while( true ) {
    LVar1 = Omega_h::Mesh::nedges(__return_storage_ptr__);
    if ((long)LVar1 <= (long)pcVar4) break;
    local_1f8._M_dataplus._M_p = pcVar4;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&this->silly_edges,(unsigned_long *)&local_1f8);
    pcVar4 = pcVar4 + 1;
  }
  pcVar4 = (pointer)0x0;
  while( true ) {
    LVar1 = Omega_h::Mesh::nverts(__return_storage_ptr__);
    if ((long)LVar1 <= (long)pcVar4) break;
    local_1f8._M_dataplus._M_p = pcVar4;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&this->silly_nodes,(unsigned_long *)&local_1f8);
    pcVar4 = pcVar4 + 1;
  }
  Omega_h::Mesh::coords((Mesh *)&coords);
  LVar1 = Omega_h::Mesh::nverts(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_1f8,"",(allocator *)local_1b8);
  Write<double>::Write(&new_coords,LVar1 * 3,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1b8[2] = (local_1a0->super_Few<double,_3>).array_[2];
  local_1b8[0] = (local_1a0->super_Few<double,_3>).array_[0];
  local_1b8[1] = (local_1a0->super_Few<double,_3>).array_[1];
  local_1f8._M_dataplus._M_p = (pointer)(x_00 * 0.5);
  local_1f8._M_string_length = (size_type)(y * 0.5);
  local_1f8.field_2._M_allocated_capacity = (size_type)(z * 0.5);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    diff.super_Few<double,_3>.array_[lVar2] =
         local_1b8[lVar2] - (double)(&local_1f8._M_dataplus)[lVar2]._M_p;
  }
  lVar2 = 0;
  lVar5 = 0;
  while( true ) {
    LVar1 = Omega_h::Mesh::nverts(__return_storage_ptr__);
    if (LVar1 <= lVar5) break;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      x.super_Few<double,_3>.array_[lVar3] =
           *(double *)((long)coords.write_.shared_alloc_.direct_ptr + lVar3 * 8 + lVar2);
    }
    local_1f8.field_2._M_allocated_capacity = (size_type)diff.super_Few<double,_3>.array_[2];
    local_1f8._M_dataplus._M_p = (pointer)diff.super_Few<double,_3>.array_[0];
    local_1f8._M_string_length = (size_type)diff.super_Few<double,_3>.array_[1];
    local_1b8[2] = x.super_Few<double,_3>.array_[2];
    local_1b8[0] = x.super_Few<double,_3>.array_[0];
    local_1b8[1] = x.super_Few<double,_3>.array_[1];
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      c_1.super_Few<double,_3>.array_[lVar3] =
           local_1b8[lVar3] + (double)(&local_1f8._M_dataplus)[lVar3]._M_p;
    }
    x.super_Few<double,_3>.array_[0] = c_1.super_Few<double,_3>.array_[0];
    x.super_Few<double,_3>.array_[1] = c_1.super_Few<double,_3>.array_[1];
    x.super_Few<double,_3>.array_[2] = c_1.super_Few<double,_3>.array_[2];
    local_1f8.field_2._M_allocated_capacity = (size_type)c_1.super_Few<double,_3>.array_[2];
    local_1f8._M_dataplus._M_p = (pointer)c_1.super_Few<double,_3>.array_[0];
    local_1f8._M_string_length = (size_type)c_1.super_Few<double,_3>.array_[1];
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      *(pointer *)((long)new_coords.shared_alloc_.direct_ptr + lVar3 * 8 + lVar2) =
           (&local_1f8._M_dataplus)[lVar3]._M_p;
    }
    lVar5 = lVar5 + 1;
    lVar2 = lVar2 + 0x18;
  }
  Write<double>::Write(&local_198,&new_coords);
  Read<double>::Read((Read<signed_char> *)&local_1f8,&local_198);
  Omega_h::Mesh::set_coords(__return_storage_ptr__,(Reals *)&local_1f8);
  Write<double>::~Write((Write<double> *)&local_1f8);
  Write<double>::~Write(&local_198);
  Omega_h::Mesh::ask_down(&local_60,__return_storage_ptr__,2,0);
  Adj::~Adj(&local_60);
  Omega_h::Mesh::ask_down(&local_90,__return_storage_ptr__,3,0);
  Adj::~Adj(&local_90);
  Omega_h::Mesh::ask_down(&local_c0,__return_storage_ptr__,3,2);
  Adj::~Adj(&local_c0);
  Omega_h::Mesh::ask_up(&local_f0,__return_storage_ptr__,2,3);
  Adj::~Adj(&local_f0);
  Write<double>::~Write(&new_coords);
  Write<double>::~Write(&coords.write_);
  return;
}

Assistant:

Overlay::Overlay(
    int* argc, char*** argv, const Omega_h::Vector<3>& overlayGridCenter,
    double cellSize, size_t Nx, size_t Ny, size_t Nz
#ifdef OMEGA_H_USE_MPI
    ,
    MPI_Comm comm
#endif
    )
    : cell_size(cellSize),
      library(argc, argv
#ifdef OMEGA_H_USE_MPI
          ,
          comm
#endif
          ),
      mesh(build_box(library.world(), OMEGA_H_HYPERCUBE, Nx * cellSize,
          Ny * cellSize, Nz * cellSize, LO(Nx), LO(Ny), LO(Nz))) {
  silly_cells.reserve(size_t(mesh.nregions()));
  silly_faces.reserve(size_t(mesh.nfaces()));
  silly_edges.reserve(size_t(mesh.nedges()));
  silly_nodes.reserve(size_t(mesh.nverts()));
  for (int i = 0; i < mesh.nregions(); ++i) silly_cells.push_back(size_t(i));
  for (int i = 0; i < mesh.nfaces(); ++i) silly_faces.push_back(size_t(i));
  for (int i = 0; i < mesh.nedges(); ++i) silly_edges.push_back(size_t(i));
  for (int i = 0; i < mesh.nverts(); ++i) silly_nodes.push_back(size_t(i));
  auto coords = mesh.coords();
  auto new_coords = Write<double>(mesh.nverts() * 3);
  auto diff = overlayGridCenter - vector_3(Nx * cellSize / 2.0,
                                      Ny * cellSize / 2.0, Nz * cellSize / 2.0);
  for (int i = 0; i < mesh.nverts(); ++i) {
    auto x = get_vector<3>(coords, i);
    x += diff;
    set_vector(new_coords, i, x);
  }
  mesh.set_coords(new_coords);
  mesh.ask_down(FACE, VERT);
  mesh.ask_down(REGION, VERT);
  mesh.ask_down(REGION, FACE);
  mesh.ask_up(FACE, REGION);
}